

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

aiMeshMorphAnim * CreateMeshMorphAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined8 *puVar1;
  Sampler *pSVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  aiMeshMorphAnim *paVar5;
  ulong *puVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  aiMeshMorphKey *paVar15;
  float *values;
  float *times;
  float *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  float *local_50;
  ulong local_48;
  long local_40 [2];
  
  paVar5 = (aiMeshMorphAnim *)operator_new(0x410);
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  paVar5->mNumKeys = 0;
  paVar5->mKeys = (aiMeshMorphKey *)0x0;
  uVar10 = (ulong)((node->super_Object).name._M_string_length != 0);
  lVar9 = *(long *)((node->matrix).value + uVar10 * 8 + -0x1c);
  local_50 = (float *)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar9,*(long *)((node->matrix).value + uVar10 * 8 + -0x1a) + lVar9)
  ;
  if (local_48 < 0x400) {
    (paVar5->mName).length = (ai_uint32)local_48;
    memcpy((paVar5->mName).data,local_50,local_48);
    (paVar5->mName).data[local_48] = '\0';
  }
  if (local_50 != (float *)local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pSVar2 = samplers->weight;
  if (pSVar2 != (Sampler *)0x0) {
    lVar9 = 0;
    local_50 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar2->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar2->input).index],&local_50);
    local_70 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((samplers->weight->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->weight->output).index],&local_70);
    pSVar2 = samplers->weight;
    uVar10 = (((pSVar2->input).vector)->
             super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(pSVar2->input).index]->count;
    uVar11 = (uint)uVar10;
    uVar10 = uVar10 & 0xffffffff;
    paVar5->mNumKeys = uVar11;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar10;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (((pSVar2->output).vector)->
                   super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[(pSVar2->output).index]->count;
    puVar6 = (ulong *)operator_new__(uVar10 * 0x20 + 8);
    *puVar6 = uVar10;
    paVar15 = (aiMeshMorphKey *)(puVar6 + 1);
    do {
      puVar1 = (undefined8 *)((long)puVar6 + lVar9 + 0x14);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&paVar15->mTime + lVar9);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar9 = lVar9 + 0x20;
    } while (uVar10 * 0x20 != lVar9);
    paVar5->mKeys = paVar15;
    local_58 = uVar10;
    if (uVar11 != 0) {
      iVar14 = SUB164(auVar4 / auVar3,0);
      uVar10 = SUB168(auVar4 / auVar3,0) & 0xffffffff;
      local_60 = uVar10 * 4;
      local_68 = uVar10 * 8;
      uVar13 = 0;
      iVar12 = 0;
      do {
        paVar15[uVar13].mTime = (double)(local_50[uVar13] * 1000.0);
        *(int *)(puVar6 + uVar13 * 4 + 4) = iVar14;
        pvVar7 = operator_new__(local_60);
        puVar6[uVar13 * 4 + 2] = (ulong)pvVar7;
        pvVar7 = operator_new__(local_68);
        puVar6[uVar13 * 4 + 3] = (ulong)pvVar7;
        if (iVar14 != 0) {
          uVar8 = 0;
          do {
            paVar15[uVar13].mValues[uVar8] = (uint)uVar8;
            paVar15[uVar13].mWeights[uVar8] =
                 (double)(float)(~-(uint)(local_70[iVar12 + (uint)uVar8] <= 0.0) &
                                (uint)local_70[iVar12 + (uint)uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar10);
          iVar12 = iVar12 + (int)uVar8;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != local_58);
    }
    if (local_50 != (float *)0x0) {
      operator_delete__(local_50);
    }
    if (local_70 != (float *)0x0) {
      operator_delete__(local_70);
    }
  }
  return paVar5;
}

Assistant:

aiMeshMorphAnim* CreateMeshMorphAnim(glTF2::Asset& r, Node& node, AnimationSamplers& samplers)
{
    aiMeshMorphAnim* anim = new aiMeshMorphAnim();
    anim->mName = GetNodeName(node);

    static const float kMillisecondsFromSeconds = 1000.f;

    if (nullptr != samplers.weight) {
        float* times = nullptr;
        samplers.weight->input->ExtractData(times);
        float* values = nullptr;
        samplers.weight->output->ExtractData(values);
        anim->mNumKeys = static_cast<uint32_t>(samplers.weight->input->count);

        const unsigned int numMorphs = samplers.weight->output->count / anim->mNumKeys;

        anim->mKeys = new aiMeshMorphKey[anim->mNumKeys];
        unsigned int k = 0u;
        for (unsigned int i = 0u; i < anim->mNumKeys; ++i) {
            anim->mKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mKeys[i].mNumValuesAndWeights = numMorphs;
            anim->mKeys[i].mValues = new unsigned int[numMorphs];
            anim->mKeys[i].mWeights = new double[numMorphs];

            for (unsigned int j = 0u; j < numMorphs; ++j, ++k) {
                anim->mKeys[i].mValues[j] = j;
                anim->mKeys[i].mWeights[j] = ( 0.f > values[k] ) ? 0.f : values[k];
            }
        }

        delete[] times;
        delete[] values;
    }

    return anim;
}